

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsProtocol.hpp
# Opt level: O3

void __thiscall xs::TestMessage::~TestMessage(TestMessage *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Message)._vptr_Message = (_func_int **)&PTR__TestMessage_0012a7b8;
  pcVar2 = (this->test)._M_dataplus._M_p;
  paVar1 = &(this->test).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

~TestMessage	(void) {}